

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_subs_s_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  char cVar1;
  short sVar2;
  float32 fVar3;
  int iVar4;
  float64 fVar5;
  long lVar6;
  fpr_t *pfVar7;
  fpr_t *pfVar8;
  fpr_t *pfVar9;
  short sVar10;
  float32 fVar11;
  int iVar12;
  long lVar13;
  char cVar14;
  short sVar15;
  float32 fVar16;
  int iVar17;
  char cVar18;
  ulong uVar19;
  float64 fVar20;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x12c6,
                  "void helper_msa_subs_s_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  pfVar7 = (env->active_fpu).fpr + wd;
  pfVar9 = (env->active_fpu).fpr + ws;
  pfVar8 = (env->active_fpu).fpr + wt;
  switch(df) {
  case 0:
    cVar1 = *(char *)pfVar9;
    uVar19 = (ulong)*(char *)pfVar8;
    cVar18 = cVar1 - *(char *)pfVar8;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)pfVar7 = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = cVar18;
      if ((long)(uVar19 + 0x7f) <= (long)cVar1) {
        cVar14 = '\x7f';
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = cVar14;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
    cVar18 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf);
    uVar19 = (ulong)cVar18;
    cVar18 = cVar1 - cVar18;
    if ((long)uVar19 < 1) {
      cVar14 = '\x7f';
      if ((long)cVar1 < (long)(uVar19 + 0x7f)) {
        cVar14 = cVar18;
      }
    }
    else {
      cVar14 = -0x80;
      if ((long)(uVar19 | 0xffffffffffffff80) < (long)cVar1) {
        cVar14 = cVar18;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = cVar14;
    return;
  case 1:
    sVar2 = *(short *)pfVar9;
    uVar19 = (ulong)*(short *)pfVar8;
    sVar10 = sVar2 - *(short *)pfVar8;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    *(short *)pfVar7 = sVar15;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar19 = (ulong)sVar10;
    sVar10 = sVar2 - sVar10;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = sVar15;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)sVar10;
    sVar10 = sVar2 - sVar10;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = sVar15;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar19 = (ulong)sVar10;
    sVar10 = sVar2 - sVar10;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = sVar15;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)sVar10;
    sVar10 = sVar2 - sVar10;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = sVar15;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar19 = (ulong)sVar10;
    sVar10 = sVar2 - sVar10;
    if ((long)uVar19 < 1) {
      sVar15 = 0x7fff;
      if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
        sVar15 = sVar10;
      }
    }
    else {
      sVar15 = -0x8000;
      if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
        sVar15 = sVar10;
      }
    }
    break;
  case 2:
    fVar3 = pfVar9->fs[0];
    uVar19 = (ulong)(int)pfVar8->fs[0];
    fVar11 = fVar3 - pfVar8->fs[0];
    if ((long)uVar19 < 1) {
      fVar16 = 0x7fffffff;
      if ((long)(int)fVar3 < (long)(uVar19 + 0x7fffffff)) {
        fVar16 = fVar11;
      }
    }
    else {
      fVar16 = 0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)(int)fVar3) {
        fVar16 = fVar11;
      }
    }
    pfVar7->fs[0] = fVar16;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    iVar12 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar19 = (ulong)iVar12;
    iVar12 = iVar4 - iVar12;
    if ((long)uVar19 < 1) {
      iVar17 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar17 = iVar12;
      }
    }
    else {
      iVar17 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar17 = iVar12;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = iVar17;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    iVar12 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar19 = (ulong)iVar12;
    iVar12 = iVar4 - iVar12;
    if ((long)uVar19 < 1) {
      iVar17 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar17 = iVar12;
      }
    }
    else {
      iVar17 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar17 = iVar12;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar17;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    iVar12 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar19 = (ulong)iVar12;
    iVar12 = iVar4 - iVar12;
    if ((long)uVar19 < 1) {
      iVar17 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar19 + 0x7fffffff)) {
        iVar17 = iVar12;
      }
    }
    else {
      iVar17 = -0x80000000;
      if ((long)(uVar19 | 0xffffffff80000000) < (long)iVar4) {
        iVar17 = iVar12;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = iVar17;
    return;
  case 3:
    uVar19 = pfVar9->fd;
    fVar5 = pfVar8->fd;
    if ((long)fVar5 < 1) {
      fVar20 = uVar19 - fVar5;
      if ((long)(fVar5 + 0x7fffffffffffffff) <= (long)uVar19) {
        fVar20 = 0x7fffffffffffffff;
      }
    }
    else {
      fVar20 = 0x8000000000000000;
      if (fVar5 + 0x8000000000000000 < uVar19) {
        fVar20 = uVar19 - fVar5;
      }
    }
    pfVar7->fd = fVar20;
    uVar19 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    lVar6 = *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if (lVar6 < 1) {
      lVar13 = 0x7fffffffffffffff;
      if ((long)uVar19 < lVar6 + 0x7fffffffffffffff) {
        lVar13 = uVar19 - lVar6;
      }
    }
    else {
      lVar13 = -0x8000000000000000;
      if (lVar6 + 0x8000000000000000U < uVar19) {
        lVar13 = uVar19 - lVar6;
      }
    }
    *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = lVar13;
    return;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = sVar15;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar19 = (ulong)sVar10;
  sVar10 = sVar2 - sVar10;
  if ((long)uVar19 < 1) {
    sVar15 = 0x7fff;
    if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
      sVar15 = sVar10;
    }
  }
  else {
    sVar15 = -0x8000;
    if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
      sVar15 = sVar10;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = sVar15;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar10 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  uVar19 = (ulong)sVar10;
  sVar10 = sVar2 - sVar10;
  if ((long)uVar19 < 1) {
    sVar15 = 0x7fff;
    if ((long)sVar2 < (long)(uVar19 + 0x7fff)) {
      sVar15 = sVar10;
    }
  }
  else {
    sVar15 = -0x8000;
    if ((long)(uVar19 | 0xffffffffffff8000) < (long)sVar2) {
      sVar15 = sVar10;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = sVar15;
  return;
}

Assistant:

MSA_BINOP_DF(subv)
MSA_BINOP_DF(subs_s)
MSA_BINOP_DF(subs_u)
MSA_BINOP_DF(subsus_u)
MSA_BINOP_DF(subsuu_s)
MSA_BINOP_DF(mulv)
MSA_BINOP_DF(dotp_s)
MSA_BINOP_DF(dotp_u)

MSA_BINOP_DF(mul_q)
MSA_BINOP_DF(mulr_q)
#undef MSA_BINOP_DF

void helper_msa_sld_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       uint32_t ws, uint32_t rt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    msa_sld_df(df, pwd, pws, env->active_tc.gpr[rt]);
}